

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::ConvolutionParameter::ConvolutionParameter
          (ConvolutionParameter *this,ConvolutionParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  FillerParameter *pFVar2;
  ConvolutionParameter *from_local;
  ConvolutionParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ConvolutionParameter_00d4e810;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->pad_,&from->pad_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField
            (&this->kernel_size_,&from->kernel_size_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->stride_,&from->stride_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->dilation_,&from->dilation_);
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  bVar1 = has_weight_filler(from);
  if (bVar1) {
    pFVar2 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar2,from->weight_filler_);
    this->weight_filler_ = pFVar2;
  }
  else {
    this->weight_filler_ = (FillerParameter *)0x0;
  }
  bVar1 = has_bias_filler(from);
  if (bVar1) {
    pFVar2 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar2,from->bias_filler_);
    this->bias_filler_ = pFVar2;
  }
  else {
    this->bias_filler_ = (FillerParameter *)0x0;
  }
  memcpy(&this->num_output_,&from->num_output_,0x30);
  return;
}

Assistant:

ConvolutionParameter::ConvolutionParameter(const ConvolutionParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      pad_(from.pad_),
      kernel_size_(from.kernel_size_),
      stride_(from.stride_),
      dilation_(from.dilation_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&group_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(group_));
  // @@protoc_insertion_point(copy_constructor:caffe.ConvolutionParameter)
}